

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompletionProvider.cpp
# Opt level: O3

void addShortEnvironmentCompletions(CompletionList *completions,File *file,PrefixData *prefix)

{
  CWL *pCVar1;
  _Hash_node_base *p_Var2;
  __node_base _Var3;
  __alloc_node_gen_t __alloc_node_gen;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LConfig::LatexConfig::CWL::CWLDef,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LConfig::LatexConfig::CWL::CWLDef>_>_>
  cwlEntries;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  loadedPackages;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LConfig::LatexConfig::CWL::CWLDef>,_true>_>_>
  local_98;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LConfig::LatexConfig::CWL::CWLDef>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LConfig::LatexConfig::CWL::CWLDef>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_90;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_58;
  
  getLoadedPackages_abi_cxx11_
            ((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_58,file);
  if ((g_config->latex).cwl.initialised == false) {
    locateAndBuildCWLFiles();
  }
  local_98._M_h = (__hashtable_alloc *)&local_90;
  local_90._M_buckets = (__buckets_ptr)0x0;
  local_90._M_bucket_count = (g_config->latex).cwl.cwlFiles._M_h._M_bucket_count;
  local_90._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_90._M_element_count = (g_config->latex).cwl.cwlFiles._M_h._M_element_count;
  pCVar1 = &(g_config->latex).cwl;
  local_90._M_rehash_policy._M_max_load_factor =
       (pCVar1->cwlFiles)._M_h._M_rehash_policy._M_max_load_factor;
  local_90._M_rehash_policy._4_4_ =
       *(undefined4 *)&(pCVar1->cwlFiles)._M_h._M_rehash_policy.field_0x4;
  local_90._M_rehash_policy._M_next_resize =
       (g_config->latex).cwl.cwlFiles._M_h._M_rehash_policy._M_next_resize;
  local_90._M_single_bucket = (__node_base_ptr)0x0;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,LConfig::LatexConfig::CWL::CWLDef>,std::allocator<std::pair<std::__cxx11::string_const,LConfig::LatexConfig::CWL::CWLDef>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,LConfig::LatexConfig::CWL::CWLDef>,std::allocator<std::pair<std::__cxx11::string_const,LConfig::LatexConfig::CWL::CWLDef>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,LConfig::LatexConfig::CWL::CWLDef>,true>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,LConfig::LatexConfig::CWL::CWLDef>,std::allocator<std::pair<std::__cxx11::string_const,LConfig::LatexConfig::CWL::CWLDef>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)local_98._M_h,&(g_config->latex).cwl.cwlFiles._M_h,&local_98);
  if (local_90._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    _Var3._M_nxt = local_90._M_before_begin._M_nxt;
    do {
      p_Var2 = _Var3._M_nxt + 0xe;
      while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
        CompletionList::addShortEnv(completions,(string *)(p_Var2 + 1),&prefix->range);
      }
      _Var3._M_nxt = (_Var3._M_nxt)->_M_nxt;
    } while (_Var3._M_nxt != (_Hash_node_base *)0x0);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LConfig::LatexConfig::CWL::CWLDef>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LConfig::LatexConfig::CWL::CWLDef>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_90);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_58);
  return;
}

Assistant:

void addShortEnvironmentCompletions (CompletionList &completions, File &file, PrefixData &prefix) {
    auto loadedPackages = getLoadedPackages(file);
    auto cwlEntries = *getCWLFiles();

    for (auto &entry : cwlEntries) {
        for (auto &env : entry.second.environments) {
            completions.addShortEnv(env.first, prefix.range);
        }
    }
}